

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O0

void __thiscall pbrt::Tensor::Tensor(Tensor *this,string *filename)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  void *__ptr;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  reference pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__off;
  pointer __ptr_00;
  string *in_RSI;
  long in_RDI;
  long cur_pos;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> data;
  uint64_t size_value;
  size_t j;
  size_t total_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  string name;
  uint64_t offset;
  uint16_t ndim;
  uint16_t name_length;
  uint8_t dtype;
  uint32_t i;
  uint32_t n_fields;
  uint8_t version [2];
  uint8_t header [12];
  long size;
  FILE *file;
  Field *in_stack_fffffffffffffe08;
  mapped_type *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  allocator_type *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  char *in_stack_fffffffffffffe40;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  char *local_d8;
  ulong local_d0;
  allocator_type *local_c8;
  undefined1 local_b9 [32];
  allocator<char> local_99;
  string local_98 [32];
  long local_78;
  ushort local_6e;
  ushort local_6c;
  byte local_69;
  uint local_68;
  uint local_64;
  char local_5e;
  char local_5d;
  undefined1 local_5c [12];
  long local_50;
  string local_48 [32];
  FILE *local_28;
  string *local_10;
  
  local_10 = in_RSI;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Tensor::Field,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Tensor::Field>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Tensor::Field,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Tensor::Field>_>_>
                   *)0x880db7);
  std::__cxx11::string::string((string *)(in_RDI + 0x38),local_10);
  std::__cxx11::string::string(local_48,local_10);
  __stream = (FILE *)FOpenRead((string *)0x880dfe);
  std::__cxx11::string::~string(local_48);
  local_28 = __stream;
  if (__stream == (FILE *)0x0) {
    ErrorExit<std::__cxx11::string_const&>(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  }
  iVar1 = fseek(__stream,0,2);
  if (iVar1 != 0) {
    fclose(local_28);
    ErrorExit<std::__cxx11::string_const&>(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  }
  local_50 = ftell(local_28);
  if (local_50 == -1) {
    fclose(local_28);
    ErrorExit<std::__cxx11::string_const&>(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  }
  *(long *)(in_RDI + 0x58) = local_50;
  rewind(local_28);
  if (*(ulong *)(in_RDI + 0x58) < 0x12) {
    fclose(local_28);
    ErrorExit<std::__cxx11::string_const&>(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  }
  sVar2 = fread(local_5c,1,0xc,local_28);
  if (sVar2 != 0xc) {
    fclose(local_28);
    ErrorExit<std::__cxx11::string_const&>(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  }
  sVar2 = fread(&local_5e,1,2,local_28);
  if (sVar2 != 2) {
    fclose(local_28);
    ErrorExit<std::__cxx11::string_const&>(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  }
  sVar2 = fread(&local_64,4,1,local_28);
  if (sVar2 != 1) {
    fclose(local_28);
    ErrorExit<std::__cxx11::string_const&>(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  }
  iVar1 = memcmp(local_5c,"tensor_file",0xc);
  if (iVar1 != 0) {
    fclose(local_28);
    ErrorExit<std::__cxx11::string_const&>(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  }
  if ((local_5e != '\x01') || (local_5d != '\0')) {
    fclose(local_28);
    ErrorExit<std::__cxx11::string_const&>(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  }
  local_68 = 0;
  while( true ) {
    if (local_64 <= local_68) {
      fclose(local_28);
      return;
    }
    sVar2 = fread(&local_6c,2,1,local_28);
    if (sVar2 != 1) {
      fclose(local_28);
      ErrorExit<std::__cxx11::string_const&>(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe30,
               CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
               (char)((ulong)in_stack_fffffffffffffe20 >> 0x38),
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    std::allocator<char>::~allocator(&local_99);
    __ptr = (void *)std::__cxx11::string::data();
    sVar2 = fread(__ptr,1,(ulong)local_6c,local_28);
    if (sVar2 != local_6c) {
      fclose(local_28);
      ErrorExit<std::__cxx11::string_const&>(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    }
    sVar2 = fread(&local_6e,2,1,local_28);
    if (sVar2 != 1) {
      fclose(local_28);
      ErrorExit<std::__cxx11::string_const&>(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    }
    sVar2 = fread(&local_69,1,1,local_28);
    if (sVar2 != 1) {
      fclose(local_28);
      ErrorExit<std::__cxx11::string_const&>(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    }
    sVar2 = fread(&local_78,8,1,local_28);
    if (sVar2 != 1) {
      fclose(local_28);
      ErrorExit<std::__cxx11::string_const&>(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    }
    if ((local_69 == 0) || (0xb < local_69)) {
      fclose(local_28);
      ErrorExit<std::__cxx11::string_const&>(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    }
    __x = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(ulong)local_6e;
    this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b9;
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x881457);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe30,
               CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
               in_stack_fffffffffffffe20);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x88147d);
    local_c8 = (allocator_type *)type_size((uint)local_69);
    for (local_d0 = 0; local_d0 < local_6e; local_d0 = local_d0 + 1) {
      sVar2 = fread(&local_d8,8,1,local_28);
      if (sVar2 != 1) {
        fclose(local_28);
        ErrorExit<std::__cxx11::string_const&>(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      }
      in_stack_fffffffffffffe40 = local_d8;
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_b9 + 1),
                          local_d0);
      *pvVar3 = (value_type)in_stack_fffffffffffffe40;
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_b9 + 1),
                          local_d0);
      local_c8 = (allocator_type *)(*pvVar3 * (long)local_c8);
    }
    in_stack_fffffffffffffe38 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         operator_new__((ulong)local_c8);
    std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
    unique_ptr<unsigned_char*,std::default_delete<unsigned_char[]>,void,bool>
              ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
               in_stack_fffffffffffffe10,(uchar *)in_stack_fffffffffffffe08);
    __off = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ftell(local_28);
    if (__off == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 0xffffffffffffffff) {
      fclose(local_28);
      ErrorExit<std::__cxx11::string_const&>(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    }
    in_stack_fffffffffffffe30 = __off;
    in_stack_fffffffffffffe2c = fseek(local_28,local_78,0);
    if (in_stack_fffffffffffffe2c == -1) break;
    __ptr_00 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                         ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                          in_stack_fffffffffffffe10);
    in_stack_fffffffffffffe20 = (allocator_type *)fread(__ptr_00,1,(size_t)local_c8,local_28);
    if (in_stack_fffffffffffffe20 != local_c8) {
      fclose(local_28);
      ErrorExit<std::__cxx11::string_const&>(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    }
    in_stack_fffffffffffffe1c = fseek(local_28,(long)__off,0);
    if (in_stack_fffffffffffffe1c == -1) {
      fclose(local_28);
      ErrorExit<std::__cxx11::string_const&>(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(this_00,__x);
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::unique_ptr
              ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
               in_stack_fffffffffffffe10,
               (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
               in_stack_fffffffffffffe08);
    in_stack_fffffffffffffe10 =
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Tensor::Field,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Tensor::Field>_>_>
         ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Tensor::Field,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Tensor::Field>_>_>
                       *)in_stack_fffffffffffffe10,(key_type *)in_stack_fffffffffffffe08);
    Field::operator=(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    Field::~Field(in_stack_fffffffffffffe10);
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
              ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
               in_stack_fffffffffffffe10);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe20);
    std::__cxx11::string::~string(local_98);
    local_68 = local_68 + 1;
  }
  fclose(local_28);
  ErrorExit<std::__cxx11::string_const&>(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
}

Assistant:

Tensor::Tensor(const std::string &filename) : m_filename(filename) {
    // Helpful macros to limit error-handling code duplication
#ifdef ASSERT
#undef ASSERT
#endif  // ASSERT

#define ASSERT(cond, msg)                            \
    do {                                             \
        if (!(cond)) {                               \
            fclose(file);                            \
            ErrorExit("%s: Tensor: " msg, filename); \
        }                                            \
    } while (0)

#define SAFE_READ(vars, size, count) \
    ASSERT(fread(vars, size, count, file) == (count), "Unable to read " #vars ".")

    FILE *file = FOpenRead(filename);
    if (file == NULL)
        ErrorExit("%s: unable to open file", filename);

    ASSERT(!fseek(file, 0, SEEK_END), "Unable to seek to end of file.");

    long size = ftell(file);
    ASSERT(size != -1, "Unable to tell file cursor position.");
    m_size = static_cast<size_t>(size);
    rewind(file);

    ASSERT(m_size >= 12 + 2 + 4, "Invalid tensor file: too small, truncated?");

    uint8_t header[12], version[2];
    uint32_t n_fields;
    SAFE_READ(header, sizeof(*header), 12);
    SAFE_READ(version, sizeof(*version), 2);
    SAFE_READ(&n_fields, sizeof(n_fields), 1);

    ASSERT(memcmp(header, "tensor_file", 12) == 0,
           "Invalid tensor file: invalid header.");
    ASSERT(version[0] == 1 && version[1] == 0,
           "Invalid tensor file: unknown file version.");

    for (uint32_t i = 0; i < n_fields; ++i) {
        uint8_t dtype;
        uint16_t name_length, ndim;
        uint64_t offset;

        SAFE_READ(&name_length, sizeof(name_length), 1);
        std::string name(name_length, '\0');
        SAFE_READ((char *)name.data(), 1, name_length);
        SAFE_READ(&ndim, sizeof(ndim), 1);
        SAFE_READ(&dtype, sizeof(dtype), 1);
        SAFE_READ(&offset, sizeof(offset), 1);
        ASSERT(dtype != Invalid && dtype <= Float64,
               "Invalid tensor file: unknown type.");

        std::vector<size_t> shape(ndim);
        size_t total_size = type_size((Type)dtype);  // no need to check here, line 43
                                                     // already removes invalid types
        for (size_t j = 0; j < (size_t)ndim; ++j) {
            uint64_t size_value;
            SAFE_READ(&size_value, sizeof(size_value), 1);
            shape[j] = (size_t)size_value;
            total_size *= shape[j];
        }

        auto data = std::unique_ptr<uint8_t[]>(new uint8_t[total_size]);

        long cur_pos = ftell(file);
        ASSERT(cur_pos != -1, "Unable to tell current cursor position.");
        ASSERT(fseek(file, offset, SEEK_SET) != -1, "Unable to seek to tensor offset.");
        SAFE_READ(data.get(), 1, total_size);
        ASSERT(fseek(file, cur_pos, SEEK_SET) != -1,
               "Unable to seek back to current position");

        m_fields[name] =
            Field{(Type)dtype, static_cast<size_t>(offset), shape, std::move(data)};
    }

    fclose(file);

#undef SAFE_READ
#undef ASSERT
}